

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O1

lzma_match *
hc_find_func(uint32_t len_limit,uint32_t pos,uint8_t *cur,uint32_t cur_match,uint32_t depth,
            uint32_t *son,uint32_t cyclic_pos,uint32_t cyclic_size,lzma_match *matches,
            uint32_t len_best)

{
  ulong uVar1;
  lzma_match *plVar2;
  ulong uVar3;
  uint32_t uVar4;
  ulong uVar5;
  uint uVar7;
  uint unaff_R12D;
  uint uVar8;
  uint8_t *puVar9;
  uint uVar10;
  bool bVar11;
  bool bVar12;
  lzma_match *local_48;
  ulong uVar6;
  
  son[cyclic_pos] = cur_match;
  do {
    bVar12 = false;
    bVar11 = depth != 0;
    depth = depth - 1;
    plVar2 = matches;
    if ((bVar11) && (uVar10 = pos - cur_match, plVar2 = matches, uVar10 < cyclic_size)) {
      puVar9 = cur + -(ulong)uVar10;
      uVar4 = 0;
      if (cyclic_pos < uVar10) {
        uVar4 = cyclic_size;
      }
      cur_match = son[(cyclic_pos - uVar10) + uVar4];
      bVar12 = true;
      plVar2 = local_48;
      if ((puVar9[len_best] == cur[len_best]) && (*puVar9 == *cur)) {
        if (len_limit == 0) {
          __assert_fail("len <= limit",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                        ,0x2e,
                        "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                       );
        }
        if ((int)len_limit < 0) {
          __assert_fail("limit <= UINT32_MAX / 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                        ,0x2f,
                        "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                       );
        }
        uVar7 = 1;
        do {
          uVar8 = len_limit;
          if (len_limit <= uVar7) break;
          uVar5 = (ulong)uVar7;
          uVar6 = (ulong)uVar7;
          uVar3 = *(long *)(puVar9 + uVar5) - *(long *)(cur + uVar6);
          if (uVar3 == 0) {
            uVar7 = uVar7 + 8;
            uVar8 = unaff_R12D;
          }
          else {
            uVar1 = 0;
            if (uVar3 != 0) {
              for (; (uVar3 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
              }
            }
            uVar7 = ((uint)(uVar1 >> 3) & 0x1fffffff) + uVar7;
            if (uVar7 < len_limit) {
              uVar8 = uVar7;
            }
          }
          unaff_R12D = uVar8;
        } while (*(long *)(puVar9 + uVar5) == *(long *)(cur + uVar6));
        if (len_best < uVar8) {
          matches->len = uVar8;
          matches->dist = uVar10 - 1;
          matches = matches + 1;
          bVar12 = uVar8 != len_limit;
          len_best = uVar8;
          if (!bVar12) {
            plVar2 = matches;
          }
        }
      }
    }
    local_48 = plVar2;
    unaff_R12D = len_best;
    if (!bVar12) {
      return local_48;
    }
  } while( true );
}

Assistant:

static lzma_match *
hc_find_func(
		const uint32_t len_limit,
		const uint32_t pos,
		const uint8_t *const cur,
		uint32_t cur_match,
		uint32_t depth,
		uint32_t *const son,
		const uint32_t cyclic_pos,
		const uint32_t cyclic_size,
		lzma_match *matches,
		uint32_t len_best)
{
	son[cyclic_pos] = cur_match;

	while (true) {
		const uint32_t delta = pos - cur_match;
		if (depth-- == 0 || delta >= cyclic_size)
			return matches;

		const uint8_t *const pb = cur - delta;
		cur_match = son[cyclic_pos - delta
				+ (delta > cyclic_pos ? cyclic_size : 0)];

		if (pb[len_best] == cur[len_best] && pb[0] == cur[0]) {
			uint32_t len = lzma_memcmplen(pb, cur, 1, len_limit);

			if (len_best < len) {
				len_best = len;
				matches->len = len;
				matches->dist = delta - 1;
				++matches;

				if (len == len_limit)
					return matches;
			}
		}
	}
}